

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::traverse_all_reachable_opcodes
          (Compiler *this,SPIRBlock *block,OpcodeHandler *handler)

{
  size_t sVar1;
  Instruction *instr;
  bool bVar2;
  int iVar3;
  uint32_t *puVar4;
  SPIRFunction *pSVar5;
  long lVar6;
  Instruction *instr_00;
  ushort uVar7;
  bool bVar8;
  
  (*handler->_vptr_OpcodeHandler[5])(handler);
  (*handler->_vptr_OpcodeHandler[6])(handler,block);
  sVar1 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
  bVar8 = sVar1 == 0;
  if (!bVar8) {
    instr = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
    puVar4 = stream(this,instr);
    uVar7 = instr->op;
    iVar3 = (*handler->_vptr_OpcodeHandler[2])(handler,(ulong)uVar7,puVar4,(ulong)instr->length);
    if ((char)iVar3 != '\0') {
      lVar6 = sVar1 * 0xc;
      do {
        lVar6 = lVar6 + -0xc;
        instr_00 = instr + 1;
        if (uVar7 == 0x39) {
          pSVar5 = Variant::get<spirv_cross::SPIRFunction>
                             ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + puVar4[2])
          ;
          iVar3 = (*handler->_vptr_OpcodeHandler[4])(handler,pSVar5);
          if ((char)iVar3 != '\0') {
            iVar3 = (*handler->_vptr_OpcodeHandler[7])(handler,puVar4,(ulong)instr->length);
            if ((char)iVar3 == '\0') break;
            pSVar5 = Variant::get<spirv_cross::SPIRFunction>
                               ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                                puVar4[2]);
            bVar2 = traverse_all_reachable_opcodes(this,pSVar5,handler);
            if (!bVar2) break;
            iVar3 = (*handler->_vptr_OpcodeHandler[8])(handler,puVar4,(ulong)instr->length);
            if ((char)iVar3 == '\0') break;
            (*handler->_vptr_OpcodeHandler[6])(handler,block);
          }
        }
        bVar8 = lVar6 == 0;
        if (bVar8) goto LAB_00336ac1;
        puVar4 = stream(this,instr_00);
        uVar7 = instr_00->op;
        iVar3 = (*handler->_vptr_OpcodeHandler[2])
                          (handler,(ulong)uVar7,puVar4,(ulong)instr[1].length);
        instr = instr_00;
      } while ((char)iVar3 != '\0');
    }
    if (!bVar8) {
      return false;
    }
  }
LAB_00336ac1:
  iVar3 = (*handler->_vptr_OpcodeHandler[3])(handler,block);
  return SUB41(iVar3,0);
}

Assistant:

bool Compiler::traverse_all_reachable_opcodes(const SPIRBlock &block, OpcodeHandler &handler) const
{
	handler.set_current_block(block);
	handler.rearm_current_block(block);

	// Ideally, perhaps traverse the CFG instead of all blocks in order to eliminate dead blocks,
	// but this shouldn't be a problem in practice unless the SPIR-V is doing insane things like recursing
	// inside dead blocks ...
	for (auto &i : block.ops)
	{
		auto ops = stream(i);
		auto op = static_cast<Op>(i.op);

		if (!handler.handle(op, ops, i.length))
			return false;

		if (op == OpFunctionCall)
		{
			auto &func = get<SPIRFunction>(ops[2]);
			if (handler.follow_function_call(func))
			{
				if (!handler.begin_function_scope(ops, i.length))
					return false;
				if (!traverse_all_reachable_opcodes(get<SPIRFunction>(ops[2]), handler))
					return false;
				if (!handler.end_function_scope(ops, i.length))
					return false;

				handler.rearm_current_block(block);
			}
		}
	}

	if (!handler.handle_terminator(block))
		return false;

	return true;
}